

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int64_t archive_read_format_rar_seek_data(archive_read *a,int64_t offset,int whence)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  int in_EDX;
  long in_RSI;
  archive *in_RDI;
  archive_entry *unaff_retaddr;
  rar *rar;
  uint i;
  int64_t ret;
  int64_t client_offset;
  undefined4 in_stack_ffffffffffffffb8;
  archive_read *a_00;
  uint local_34;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_8;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  if ((a_00->archive).field_0x17 != '0') {
    archive_set_error(in_RDI,-1,"Seeking of compressed RAR files is unsupported");
    return -0x19;
  }
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      local_28 = (a_00->client).opener;
      goto LAB_0014bf1a;
    }
    if (in_EDX == 2) {
      local_28 = (a_00->archive).compression_name;
      goto LAB_0014bf1a;
    }
  }
  local_28 = (char *)0x0;
LAB_0014bf1a:
  local_28 = local_28 + in_RSI;
  if ((long)local_28 < 0) {
    return -1;
  }
  if ((long)(a_00->archive).compression_name < (long)local_28) {
    (a_00->client).opener = local_28;
    local_28 = (a_00->archive).compression_name;
  }
  local_28 = local_28 + *(long *)((a_00->client).position + 8);
  local_34 = 0;
  while (local_34 < *(uint *)&(a_00->client).dataset) {
    local_28 = local_28 +
               (*(long *)((a_00->client).position + (ulong)(local_34 + 1) * 0x18 + 8) -
               *(long *)((a_00->client).position + (ulong)local_34 * 0x18 + 0x10));
    local_34 = local_34 + 1;
  }
  if (((a_00->archive).magic & 1) != 0) {
    do {
      while ((*(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18 + 8
                       ) <= (long)local_28 ||
             (((ulong)(a_00->archive).archive_format_name & 1) == 0))) {
        if (((long)local_28 <=
             *(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18 +
                      0x10)) || (((ulong)(a_00->archive).archive_format_name & 2) == 0))
        goto LAB_0014c407;
        *(int *)&(a_00->client).dataset = *(int *)&(a_00->client).dataset + 1;
        if ((*(uint *)&(a_00->client).dataset < *(uint *)((long)&(a_00->client).dataset + 4)) &&
           (*(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18 +
                     0x10) < (long)local_28)) {
          local_28 = local_28 +
                     (*(long *)((a_00->client).position +
                                (ulong)*(uint *)&(a_00->client).dataset * 0x18 + 8) -
                     *(long *)((a_00->client).position +
                               (ulong)(*(int *)&(a_00->client).dataset - 1) * 0x18 + 0x10));
        }
        else {
          *(int *)&(a_00->client).dataset = *(int *)&(a_00->client).dataset + -1;
          iVar3 = __archive_read_seek(a_00,CONCAT44(in_EDX,in_stack_ffffffffffffffb8),0);
          if (iVar3 < 0) {
            return iVar3;
          }
          iVar2 = archive_read_format_rar_read_header((archive_read *)rar,unaff_retaddr);
          if (iVar2 == 1) {
            *(undefined1 *)&(a_00->client).cursor = 1;
            iVar2 = archive_read_format_rar_read_header((archive_read *)rar,unaff_retaddr);
          }
          if (iVar2 != 0) {
            archive_set_error(in_RDI,-1,"Error during seek of RAR file");
            return -0x19;
          }
          local_28 = local_28 +
                     (*(long *)((a_00->client).position +
                                (ulong)*(uint *)&(a_00->client).dataset * 0x18 + 8) -
                     *(long *)((a_00->client).position +
                               (ulong)(*(int *)&(a_00->client).dataset - 1) * 0x18 + 0x10));
        }
      }
      if (*(int *)&(a_00->client).dataset == 0) {
        archive_set_error(in_RDI,-1,"Attempt to seek past beginning of RAR data block");
        return -0x19;
      }
      *(int *)&(a_00->client).dataset = *(int *)&(a_00->client).dataset + -1;
      local_28 = local_28 +
                 -(*(long *)((a_00->client).position +
                             (ulong)(*(int *)&(a_00->client).dataset + 1) * 0x18 + 8) -
                  *(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18
                           + 0x10));
    } while ((long)local_28 <
             *(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18 + 8)
            );
    iVar3 = __archive_read_seek(a_00,CONCAT44(in_EDX,in_stack_ffffffffffffffb8),0);
    if (iVar3 < 0) {
      return iVar3;
    }
    iVar2 = archive_read_format_rar_read_header((archive_read *)rar,unaff_retaddr);
    if (iVar2 != 0) {
      archive_set_error(in_RDI,-1,"Error during seek of RAR file");
      return -0x19;
    }
    *(int *)&(a_00->client).dataset = *(int *)&(a_00->client).dataset + -1;
  }
LAB_0014c407:
  local_30 = (undefined1 *)__archive_read_seek(a_00,CONCAT44(in_EDX,in_stack_ffffffffffffffb8),0);
  local_8 = local_30;
  if (-1 < (long)local_30) {
    a_00->read_data_output_offset =
         *(long *)((a_00->client).position + (ulong)*(uint *)&(a_00->client).dataset * 0x18 + 0x10)
         - (long)local_30;
    local_34 = *(uint *)&(a_00->client).dataset;
    while (local_34 != 0) {
      local_30 = local_30 +
                 -(*(long *)((a_00->client).position + (ulong)local_34 * 0x18 + 8) -
                  *(long *)((a_00->client).position + (ulong)(local_34 - 1) * 0x18 + 0x10));
      local_34 = local_34 - 1;
    }
    lVar1 = *(long *)((a_00->client).position + 8);
    *(undefined8 *)&in_RDI[1].compression_code = 0;
    in_RDI[1].compression_name = (char *)0x0;
    in_RDI[1].file_count = 0;
    in_RDI[1].archive_error_number = 0;
    in_RDI[1].error = (char *)0x0;
    a_00->read_data_offset = 0;
    *(undefined8 *)&a_00->read_data_is_posix_read = 0;
    if ((local_30 + -lVar1 == (a_00->archive).compression_name) &&
       ((long)(a_00->archive).compression_name < (long)(a_00->client).opener)) {
      local_8 = (a_00->client).opener;
    }
    else {
      (a_00->client).opener = local_30 + -lVar1;
      local_8 = (a_00->client).opener;
    }
  }
  return (int64_t)local_8;
}

Assistant:

static int64_t
archive_read_format_rar_seek_data(struct archive_read *a, int64_t offset,
    int whence)
{
  int64_t client_offset, ret;
  unsigned int i;
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->compression_method == COMPRESS_METHOD_STORE)
  {
    /* Modify the offset for use with SEEK_SET */
    switch (whence)
    {
      case SEEK_CUR:
        client_offset = rar->offset_seek;
        break;
      case SEEK_END:
        client_offset = rar->unp_size;
        break;
      case SEEK_SET:
      default:
        client_offset = 0;
    }
    client_offset += offset;
    if (client_offset < 0)
    {
      /* Can't seek past beginning of data block */
      return -1;
    }
    else if (client_offset > rar->unp_size)
    {
      /*
       * Set the returned offset but only seek to the end of
       * the data block.
       */
      rar->offset_seek = client_offset;
      client_offset = rar->unp_size;
    }

    client_offset += rar->dbo[0].start_offset;
    i = 0;
    while (i < rar->cursor)
    {
      i++;
      client_offset += rar->dbo[i].start_offset - rar->dbo[i-1].end_offset;
    }
    if (rar->main_flags & MHD_VOLUME)
    {
      /* Find the appropriate offset among the multivolume archive */
      while (1)
      {
        if (client_offset < rar->dbo[rar->cursor].start_offset &&
          rar->file_flags & FHD_SPLIT_BEFORE)
        {
          /* Search backwards for the correct data block */
          if (rar->cursor == 0)
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Attempt to seek past beginning of RAR data block");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          client_offset -= rar->dbo[rar->cursor+1].start_offset -
            rar->dbo[rar->cursor].end_offset;
          if (client_offset < rar->dbo[rar->cursor].start_offset)
            continue;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor].header_size, SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          break;
        }
        else if (client_offset > rar->dbo[rar->cursor].end_offset &&
          rar->file_flags & FHD_SPLIT_AFTER)
        {
          /* Search forward for the correct data block */
          rar->cursor++;
          if (rar->cursor < rar->nodes &&
            client_offset > rar->dbo[rar->cursor].end_offset)
          {
            client_offset += rar->dbo[rar->cursor].start_offset -
              rar->dbo[rar->cursor-1].end_offset;
            continue;
          }
          rar->cursor--;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].end_offset,
                                    SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret == (ARCHIVE_EOF))
          {
            rar->has_endarc_header = 1;
            ret = archive_read_format_rar_read_header(a, a->entry);
          }
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          client_offset += rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor-1].end_offset;
          continue;
        }
        break;
      }
    }

    ret = __archive_read_seek(a, client_offset, SEEK_SET);
    if (ret < (ARCHIVE_OK))
      return ret;
    rar->bytes_remaining = rar->dbo[rar->cursor].end_offset - ret;
    i = rar->cursor;
    while (i > 0)
    {
      i--;
      ret -= rar->dbo[i+1].start_offset - rar->dbo[i].end_offset;
    }
    ret -= rar->dbo[0].start_offset;

    /* Always restart reading the file after a seek */
    a->read_data_block = NULL;
    a->read_data_offset = 0;
    a->read_data_output_offset = 0;
    a->read_data_remaining = 0;
    rar->bytes_unconsumed = 0;
    rar->offset = 0;

    /*
     * If a seek past the end of file was requested, return the requested
     * offset.
     */
    if (ret == rar->unp_size && rar->offset_seek > rar->unp_size)
      return rar->offset_seek;

    /* Return the new offset */
    rar->offset_seek = ret;
    return rar->offset_seek;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
      "Seeking of compressed RAR files is unsupported");
  }
  return (ARCHIVE_FAILED);
}